

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

size_t ggml_dyn_tallocr_alloc(ggml_dyn_tallocr *alloc,size_t size,ggml_tensor *tensor)

{
  size_t sVar1;
  size_t *psVar2;
  long lVar3;
  size_t in_RSI;
  size_t *in_RDI;
  int j;
  size_t offset;
  free_block *block;
  free_block *block_2;
  free_block *block_1;
  int i;
  size_t best_fit_size;
  int best_fit_block;
  size_t max_avail;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  int local_5c;
  int local_34;
  ulong local_30;
  int local_24;
  ulong local_20;
  
  local_78 = aligned_offset((void *)0x0,in_RSI,*in_RDI);
  local_20 = 0;
  local_24 = -1;
  local_30 = 0xffffffffffffffff;
  for (local_34 = 0; local_34 < (int)in_RDI[1] + -1; local_34 = local_34 + 1) {
    lVar3 = (long)local_34;
    if (in_RDI[lVar3 * 2 + 3] < local_20) {
      local_68 = local_20;
    }
    else {
      local_68 = in_RDI[lVar3 * 2 + 3];
    }
    local_20 = local_68;
    if ((local_78 <= in_RDI[lVar3 * 2 + 3]) && (in_RDI[lVar3 * 2 + 3] <= local_30)) {
      local_24 = local_34;
      local_30 = in_RDI[lVar3 * 2 + 3];
    }
  }
  if (local_24 == -1) {
    lVar3 = (long)((int)in_RDI[1] + -1);
    if (in_RDI[lVar3 * 2 + 3] < local_20) {
      local_70 = local_20;
    }
    else {
      local_70 = in_RDI[lVar3 * 2 + 3];
    }
    if (in_RDI[lVar3 * 2 + 3] < local_78) {
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,
                        "%s: not enough space in the buffer to allocate %zu bytes, largest block available %zu bytes\n"
                        ,"ggml_dyn_tallocr_alloc",local_78,local_70);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,0xb6,"not enough space in the buffer");
    }
    local_24 = (int)in_RDI[1] + -1;
  }
  psVar2 = in_RDI + (long)local_24 * 2 + 2;
  sVar1 = *psVar2;
  *psVar2 = sVar1 + local_78;
  psVar2[1] = psVar2[1] - local_78;
  if (psVar2[1] == 0) {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
    for (local_5c = local_24; local_5c < (int)in_RDI[1]; local_5c = local_5c + 1) {
      in_RDI[(long)local_5c * 2 + 2] = in_RDI[(long)(local_5c + 1) * 2 + 2];
      (in_RDI + (long)local_5c * 2 + 2)[1] = (in_RDI + (long)(local_5c + 1) * 2 + 2)[1];
    }
  }
  if (sVar1 + local_78 < in_RDI[0x202]) {
    local_78 = in_RDI[0x202];
  }
  else {
    local_78 = sVar1 + local_78;
  }
  in_RDI[0x202] = local_78;
  return sVar1;
}

Assistant:

static size_t ggml_dyn_tallocr_alloc(struct ggml_dyn_tallocr * alloc, size_t size, const struct ggml_tensor * tensor) {
    size = aligned_offset(NULL, size, alloc->alignment);

    AT_PRINTF("%s: allocating %s (%zu bytes) - ", __func__, tensor->name, size);

    size_t max_avail = 0;

    // find the best fitting free block besides the last block
    int best_fit_block = -1;
    size_t best_fit_size = SIZE_MAX;
    for (int i = 0; i < alloc->n_free_blocks - 1; i++) {
        struct free_block * block = &alloc->free_blocks[i];
        max_avail = MAX(max_avail, block->size);
        if (block->size >= size && block->size <= best_fit_size) {
            best_fit_block = i;
            best_fit_size = block->size;
        }
    }

    if (best_fit_block == -1) {
        // the last block is our last resort
        struct free_block * block = &alloc->free_blocks[alloc->n_free_blocks - 1];
        max_avail = MAX(max_avail, block->size);
        if (block->size >= size) {
            best_fit_block = alloc->n_free_blocks - 1;
        } else {
            // this should never happen
            GGML_LOG_ERROR("%s: not enough space in the buffer to allocate %zu bytes, largest block available %zu bytes\n",
                    __func__, size, max_avail);
            GGML_ABORT("not enough space in the buffer");
        }
    }

    struct free_block * block = &alloc->free_blocks[best_fit_block];
    size_t offset = block->offset;
    block->offset = offset + size;
    block->size -= size;
    if (block->size == 0) {
        // remove block if empty
        alloc->n_free_blocks--;
        for (int j = best_fit_block; j < alloc->n_free_blocks; j++) {
            alloc->free_blocks[j] = alloc->free_blocks[j+1];
        }
    }

    AT_PRINTF("block %d, offset %zu\n", best_fit_block, offset);

#ifdef GGML_ALLOCATOR_DEBUG
    add_allocated_tensor(alloc, offset, tensor);
    size_t cur_max = offset + size;
    if (cur_max > alloc->max_size) {
        // sort allocated_tensors by offset
        for (int i = 0; i < 1024; i++) {
            for (int j = i + 1; j < 1024; j++) {
                if (alloc->allocated_tensors[i].offset > alloc->allocated_tensors[j].offset) {
                    const struct ggml_tensor * tmp_tensor = alloc->allocated_tensors[i].tensor;
                    size_t tmp_offset = alloc->allocated_tensors[i].offset;
                    alloc->allocated_tensors[i].tensor = alloc->allocated_tensors[j].tensor;
                    alloc->allocated_tensors[i].offset = alloc->allocated_tensors[j].offset;
                    alloc->allocated_tensors[j].tensor = tmp_tensor;
                    alloc->allocated_tensors[j].offset = tmp_offset;
                }
            }
        }
        GGML_LOG_DEBUG("max_size = %.2f MB: tensors: ", cur_max / 1024.0 / 1024.0);
        for (int i = 0; i < 1024; i++) {
            if (alloc->allocated_tensors[i].tensor) {
                GGML_LOG_DEBUG("%s [%zx-%zx] (%.2f MB) ", alloc->allocated_tensors[i].tensor->name,
                    alloc->allocated_tensors[i].offset,
                    alloc->allocated_tensors[i].offset + ggml_nbytes(alloc->allocated_tensors[i].tensor),
                    ggml_nbytes(alloc->allocated_tensors[i].tensor) / 1024.0 / 1024.0);
            }
        }
        GGML_LOG_DEBUG("\n");
    }
#endif

    alloc->max_size = MAX(alloc->max_size, offset + size);

    return offset;

    GGML_UNUSED(tensor);
}